

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O3

void __thiscall
Am_Value_List::Insert
          (Am_Value_List *this,Am_Method_Wrapper *value,Am_Insert_Position position,bool unique)

{
  Am_List_Item *pAVar1;
  int iVar2;
  undefined4 extraout_var;
  Am_List_Item *pAVar3;
  Am_Value_List_Data *pAVar4;
  Am_List_Item **ppAVar5;
  Am_Value store;
  Am_Value local_30;
  
  pAVar4 = this->data;
  if (pAVar4 == (Am_Value_List_Data *)0x0) {
    pAVar4 = (Am_Value_List_Data *)operator_new(0x20);
    Am_Value_List_Data::Am_Value_List_Data(pAVar4);
  }
  else {
    if ((!unique) || ((pAVar4->super_Am_Wrapper).refs == 1)) goto LAB_0022ce14;
    iVar2 = (*(pAVar4->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[5])();
    pAVar4 = (Am_Value_List_Data *)CONCAT44(extraout_var,iVar2);
    pAVar3 = this->item;
    if (pAVar3 != (Am_List_Item *)0x0) {
      ppAVar5 = &pAVar4->head;
      do {
        pAVar3 = pAVar3->prev;
        pAVar1 = *ppAVar5;
        ppAVar5 = &pAVar1->next;
      } while (pAVar3 != (Am_List_Item *)0x0);
      this->item = pAVar1;
    }
  }
  this->data = pAVar4;
LAB_0022ce14:
  Am_Value::Am_Value(&local_30,value);
  Am_Value_List_Data::Insert(this->data,&local_30,this->item,position);
  Am_Value::~Am_Value(&local_30);
  return;
}

Assistant:

void Am_Value_List::Insert(const Am_Value &value,
                                           Am_Insert_Position position,
                                           bool unique)
{
  if (data) {
    if (unique)
      data->Make_Unique(data, item);
  } else
    data = new Am_Value_List_Data();
  data->Insert(value, item, position);
}